

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

bool __thiscall
cmFindPackageCommand::FindConfigFile(cmFindPackageCommand *this,string *dir,string *file)

{
  bool bVar1;
  const_iterator cVar2;
  pointer pbVar3;
  
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->IgnoredPaths)._M_t,dir);
  if (((_Rb_tree_header *)cVar2._M_node == &(this->IgnoredPaths)._M_t._M_impl.super__Rb_tree_header)
     && (pbVar3 = (this->Configs).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        pbVar3 != (this->Configs).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish)) {
    do {
      std::__cxx11::string::_M_assign((string *)file);
      std::__cxx11::string::append((char *)file);
      std::__cxx11::string::_M_append((char *)file,(ulong)(pbVar3->_M_dataplus)._M_p);
      if (this->DebugMode == true) {
        FindConfigFile((cmFindPackageCommand *)file);
      }
      bVar1 = cmsys::SystemTools::FileExists((file->_M_dataplus)._M_p,true);
      if ((bVar1) && (bVar1 = CheckVersion(this,file), bVar1)) {
        return true;
      }
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != (this->Configs).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return false;
}

Assistant:

bool cmFindPackageCommand::FindConfigFile(std::string const& dir,
                                          std::string& file)
{
  if (this->IgnoredPaths.count(dir))
    {
    return false;
    }

  for(std::vector<std::string>::const_iterator ci = this->Configs.begin();
      ci != this->Configs.end(); ++ci)
    {
    file = dir;
    file += "/";
    file += *ci;
    if(this->DebugMode)
      {
      fprintf(stderr, "Checking file [%s]\n", file.c_str());
      }
    if(cmSystemTools::FileExists(file.c_str(), true) &&
       this->CheckVersion(file))
      {
      return true;
      }
    }
  return false;
}